

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O0

char * docopt::value::kindAsString(Kind kind)

{
  char *pcStack_10;
  Kind kind_local;
  
  switch(kind) {
  case Empty:
    pcStack_10 = "empty";
    break;
  case Bool:
    pcStack_10 = "bool";
    break;
  case Long:
    pcStack_10 = "long";
    break;
  case String:
    pcStack_10 = "string";
    break;
  case StringList:
    pcStack_10 = "string-list";
    break;
  default:
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

static const char* kindAsString(Kind kind) {
			switch (kind) {
				case Kind::Empty: return "empty";
				case Kind::Bool: return "bool";
				case Kind::Long: return "long";
				case Kind::String: return "string";
				case Kind::StringList: return "string-list";
			}
			return "unknown";
		}